

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::BinsSelectExpressionSyntax::isKind(SyntaxKind kind)

{
  if ((((BinsSelectConditionExpr < kind) || ((0x8050000000000U >> ((ulong)kind & 0x3f) & 1) == 0))
      && (kind != ParenthesizedBinsSelectExpr)) &&
     ((kind != SimpleBinsSelectExpr && (kind != UnaryBinsSelectExpr)))) {
    return false;
  }
  return true;
}

Assistant:

bool BinsSelectExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BinSelectWithFilterExpr:
        case SyntaxKind::BinaryBinsSelectExpr:
        case SyntaxKind::BinsSelectConditionExpr:
        case SyntaxKind::ParenthesizedBinsSelectExpr:
        case SyntaxKind::SimpleBinsSelectExpr:
        case SyntaxKind::UnaryBinsSelectExpr:
            return true;
        default:
            return false;
    }
}